

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::ListValue::ByteSizeLong(ListValue *this)

{
  void **ppvVar1;
  const_iterator cVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar4 = (size_t)*(int *)((long)&this->field_0 + 8);
  ppvVar1 = internal::RepeatedPtrFieldBase::elements
                      ((RepeatedPtrFieldBase *)&(this->field_0)._impl_);
  cVar2 = RepeatedPtrField<google::protobuf::Value>::end(&(this->field_0)._impl_.values_);
  for (; ppvVar1 != cVar2.it_; ppvVar1 = ppvVar1 + 1) {
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::Value>((Value *)*ppvVar1);
    sVar4 = sVar4 + sVar3;
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar4,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t ListValue::ByteSizeLong() const {
  const ListValue& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.ListValue)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.Value values = 1;
    {
      total_size += 1UL * this_._internal_values_size();
      for (const auto& msg : this_._internal_values()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}